

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  ulong uVar1;
  double dVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  char *__format;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  void *local_98;
  void *local_90;
  ulong local_88;
  double *local_60;
  
  dVar8 = pow(eps,0.3333333333333333);
  __ptr = malloc((long)N * 8);
  __ptr_00 = malloc((long)N * 8);
  dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
  __format = "Program Exiting as the function value exceeds the maximum double value";
  if (ABS(dVar9) < 1.79769313486232e+308) {
    if (!NAN(dVar9)) {
      if (0 < N) {
        uVar4 = 0;
        do {
          dVar10 = x[uVar4];
          if (ABS(dVar10) < 1.0 / ABS(dx[uVar4])) {
            dVar10 = signx(dVar10);
            dVar10 = dVar10 / ABS(dx[uVar4]);
          }
          *(double *)((long)__ptr + uVar4 * 8) = dVar10 * dVar8;
          dVar11 = x[uVar4];
          dVar10 = dVar10 * dVar8 + dVar11;
          x[uVar4] = dVar10;
          *(double *)((long)__ptr + uVar4 * 8) = dVar10 - dVar11;
          dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
          *(double *)((long)__ptr_00 + uVar4 * 8) = dVar10;
          if (1.79769313486232e+308 <= ABS(dVar10)) goto LAB_001242f0;
          if (NAN(dVar10)) goto LAB_001242f9;
          x[uVar4] = dVar11;
          uVar4 = uVar4 + 1;
        } while ((uint)N != uVar4);
      }
      if (N < 1) {
        iVar6 = 0;
      }
      else {
        uVar3 = (ulong)(uint)N;
        local_60 = f + 1;
        pdVar5 = x + 1;
        uVar4 = 0;
        local_98 = __ptr;
        local_90 = __ptr_00;
        local_88 = uVar3;
        do {
          local_88 = local_88 - 1;
          local_90 = (void *)((long)local_90 + 8);
          local_98 = (void *)((long)local_98 + 8);
          dVar8 = x[uVar4];
          dVar10 = *(double *)((long)__ptr + uVar4 * 8);
          x[uVar4] = dVar10 + dVar10 + dVar8;
          dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
          if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_001242f0;
          if (NAN(dVar11)) goto LAB_001242f9;
          dVar2 = *(double *)((long)__ptr_00 + uVar4 * 8);
          dVar13 = dVar9 - dVar2;
          f[uVar4 + (uint)((int)uVar4 * N)] = ((dVar11 + dVar13) - dVar2) / (dVar10 * dVar10);
          x[uVar4] = dVar8 + dVar10;
          uVar1 = uVar4 + 1;
          if (uVar1 < uVar3) {
            uVar7 = 0;
            do {
              dVar11 = pdVar5[uVar7];
              dVar2 = *(double *)((long)local_98 + uVar7 * 8);
              pdVar5[uVar7] = dVar11 + dVar2;
              dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
              if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_001242f0;
              if (NAN(dVar12)) goto LAB_001242f9;
              local_60[uVar7] =
                   ((dVar12 + dVar13) - *(double *)((long)local_90 + uVar7 * 8)) / (dVar2 * dVar10);
              pdVar5[uVar7] = dVar11;
              uVar7 = uVar7 + 1;
            } while (local_88 != uVar7);
          }
          x[uVar4] = dVar8;
          local_60 = local_60 + uVar3 + 1;
          pdVar5 = pdVar5 + 1;
          iVar6 = 0;
          uVar4 = uVar1;
        } while (uVar1 != uVar3);
      }
      goto LAB_0012430d;
    }
LAB_001242f9:
    __format = "Program Exiting as the function returns NaN";
  }
  goto LAB_00124300;
LAB_001242f0:
  __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00124300:
  printf(__format);
  iVar6 = 0xf;
LAB_0012430d:
  free(__ptr);
  free(__ptr_00);
  return iVar6;
}

Assistant:

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,step,retval;
	double fd,temp,ft,fc,temp2,stepmax;
	double *stepsize,*f2;
	/*
	Returns Upper Triangular matrix only. If you want the full matrix then either use hessian_fd or copy the upper triangular value to lower triangle.
	*/
	fd = pow((double) eps,1.0/3.0);
	
	stepsize = (double*) malloc(sizeof(double) *N);
	f2 = (double*) malloc(sizeof(double) *N);
	retval = 0;
	fc = FUNCPT_EVAL(funcpt,x,N);
	if (fc >= DBL_MAX || fc <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(stepsize);
		free(f2);
		return 15;
	}
	if (fc != fc) {
		printf("Program Exiting as the function returns NaN");
		free(stepsize);
		free(f2);
		return 15;
	}
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= (1.0 / fabs(dx[i]))) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepsize[i] = fd * stepmax;
		temp = x[i];
		x[i] += stepsize[i];
		stepsize[i] = x[i] - temp;
		
		f2[i] = FUNCPT_EVAL(funcpt,x,N);
		if (f2[i] >= DBL_MAX || f2[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (f2[i] != f2[i]) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		x[i] = temp;
	}
	
	for(i = 0; i < N;++i) { 
		step = i *N;
		temp = x[i];
		x[i] += 2*stepsize[i];
		ft = FUNCPT_EVAL(funcpt, x, N);
		if (ft >= DBL_MAX || ft <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (ft != ft) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		f[step+i] = (fc - f2[i] + ft - f2[i])/(stepsize[i] * stepsize[i]);
		x[i] = temp + stepsize[i];
		for(j = i+1; j < N;++j) {
			temp2 = x[j];
			x[j] += stepsize[j];
			ft = FUNCPT_EVAL(funcpt, x, N);
			if (ft >= DBL_MAX || ft <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(stepsize);
				free(f2);
				return 15;
			}
			if (ft != ft) {
				printf("Program Exiting as the function returns NaN");
				free(stepsize);
				free(f2);
				return 15;
			}
			f[step+j] = (fc - f2[i] + ft - f2[j])/(stepsize[i] * stepsize[j]);
			x[j] = temp2;
		}
		x[i] = temp;
			
	}
	
	free(stepsize);
	free(f2);
	return retval;
}